

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall
ShortJapaneseStringFixture_IndexStdString_Test::~ShortJapaneseStringFixture_IndexStdString_Test
          (ShortJapaneseStringFixture_IndexStdString_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (ShortJapaneseStringFixture, IndexStdString) {
    std::string::const_iterator begin = std::begin (str);
    std::string::const_iterator end = std::end (str);

    auto it = begin;
    ASSERT_EQ (it, pstore::utf::index (begin, end, 0));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 1));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 2));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 3));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 4));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 5));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 6));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 7));
    std::advance (it, 3);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 8));

    ASSERT_EQ (end, pstore::utf::index (begin, end, 9));
}